

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O2

int __thiscall CmdLineArgsParser::Parse(CmdLineArgsParser *this,LPWSTR oneArg)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 *puVar4;
  WCHAR WVar5;
  int iVar6;
  undefined8 *in_FS_OFFSET;
  WCHAR local_428 [4];
  char16 buffer [512];
  
  memset(local_428,0,0x400);
  this->pszCurrentArg = oneArg;
  if (oneArg == (LPWSTR)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/CmdParser.cpp"
                       ,0x288,"(0 != this->pszCurrentArg)","How can command line give NULL argv\'s")
    ;
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
    oneArg = this->pszCurrentArg;
  }
  if (*oneArg == L'-') {
    WVar5 = oneArg[1];
    if (WVar5 == L'-') {
      WVar5 = oneArg[2];
      oneArg = oneArg + 1;
    }
    this->pszCurrentArg = oneArg + 1;
    if (WVar5 == L'?') {
      PrintUsage(this);
      iVar6 = -1;
    }
    else {
      iVar6 = 0;
      ParseFlag(this);
    }
  }
  else {
    if ((this->flagTable->Filename).pszValue != (char16 *)0x0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = L"Duplicate filename entry";
      __cxa_throw(puVar4,&Exception::typeinfo,0);
    }
    iVar6 = 0;
    ParseString(this,local_428,0x200,false);
    Js::String::Set(&this->flagTable->Filename,local_428);
  }
  return iVar6;
}

Assistant:

int CmdLineArgsParser::Parse(__in LPWSTR oneArg) throw()
{
    int err = 0;
    char16 buffer[MaxTokenSize];
    ZeroMemory(buffer, sizeof(buffer));

    this->pszCurrentArg = oneArg;
    AssertMsg(NULL != this->pszCurrentArg, "How can command line give NULL argv's");
    try
    {
        switch(CurChar())
        {
        case '-' :
            if ('-' == PeekChar())
            {
                //support --
                NextChar();
            }
            //fallthrough
#ifdef _WIN32
        // Only support '/' as a command line switch start char on Windows
        // for legacy reason. Deprecate on xplat, as it starts a path on Unix.
        case '/':
#endif
            NextChar();
            if('?' == CurChar())
            {
                PrintUsage();
                return -1;
            }
            ParseFlag();
            break;
        default:
            if(NULL != this->flagTable.Filename)
            {
                throw Exception(_u("Duplicate filename entry"));
            }

            this->flagTable.Filename = ParseString(buffer, MaxTokenSize, false);
            break;
        }
    }
    catch(Exception &exp)
    {
        Output::Print(_u("%s : %s\n"), (LPCWSTR)exp, oneArg);
        err = -1;
    }
    return err;
}